

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintInt64_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,int64_t val)

{
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  int64_t val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._8_8_ = val;
  anon_unknown_14::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintInt64
            (&this->delegate_,generator.output_.field_2._8_8_,(BaseTextGenerator *)local_48);
  (anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_48);
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintInt64(int64_t val) const {
  FORWARD_IMPL(PrintInt64, val);
}